

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O2

bool __thiscall
fast_float::large_mul<(unsigned_short)62>
          (fast_float *this,stackvec<(unsigned_short)62> *x,limb_span y)

{
  bool bVar1;
  limb_span y_00;
  
  y_00.length = y.ptr;
  if (y_00.length == (unsigned_long *)0x1) {
    bVar1 = small_mul<(unsigned_short)62>((stackvec<(unsigned_short)62> *)this,x->data[0]);
  }
  else {
    y_00.ptr = x->data;
    bVar1 = long_mul<(unsigned_short)62>((stackvec<(unsigned_short)62> *)this,y_00);
  }
  return bVar1 != false;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool large_mul(stackvec<size>& x, limb_span y) noexcept {
  if (y.len() == 1) {
    FASTFLOAT_TRY(small_mul(x, y[0]));
  } else {
    FASTFLOAT_TRY(long_mul(x, y));
  }
  return true;
}